

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O0

void __thiscall EmulNet::EmulNet(EmulNet *this,Params *p)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  Params *p_local;
  EmulNet *this_local;
  
  this->_vptr_EmulNet = (_func_int **)&PTR__EmulNet_00114cc0;
  EM::EM(&this->emulnet);
  this->par = p;
  EM::setNextId(&this->emulnet,1);
  EM::settCurrBuffSize(&this->emulnet,0);
  this->enInited = 0;
  for (local_1c = 0; local_1c < 1000; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 0xe10; local_20 = local_20 + 1) {
      this->sent_msgs[local_1c][local_20] = 0;
      this->recv_msgs[local_1c][local_20] = 0;
    }
  }
  return;
}

Assistant:

EmulNet::EmulNet(Params *p)
{
	//trace.funcEntry("EmulNet::EmulNet");
	int i,j;
	par = p;
	emulnet.setNextId(1);
	emulnet.settCurrBuffSize(0);
	enInited=0;
	for ( i = 0; i < MAX_NODES; i++ ) {
		for ( j = 0; j < MAX_TIME; j++ ) {
			sent_msgs[i][j] = 0;
			recv_msgs[i][j] = 0;
		}
	}
	//trace.funcExit("EmulNet::EmulNet", SUCCESS);
}